

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * soul::Value::createFloatVectorArray(InterleavedView<float> data)

{
  ChannelCount CVar1;
  FrameCount FVar2;
  Value *in_RDI;
  InterleavedView<float> local_78;
  PrimitiveType local_4c;
  Type local_48;
  Type local_30;
  undefined1 local_11;
  Value *v;
  
  local_11 = 0;
  PrimitiveType::PrimitiveType(&local_4c,float32);
  CVar1 = choc::buffer::BufferView<float,_choc::buffer::InterleavedLayout>::getNumChannels
                    ((BufferView<float,_choc::buffer::InterleavedLayout> *)&stack0x00000008);
  Type::createVector(&local_48,&local_4c,(ulong)CVar1);
  FVar2 = choc::buffer::BufferView<float,_choc::buffer::InterleavedLayout>::getNumFrames
                    ((BufferView<float,_choc::buffer::InterleavedLayout> *)&stack0x00000008);
  Type::createArray(&local_30,&local_48,(ulong)FVar2);
  Value(in_RDI,&local_30);
  Type::~Type(&local_30);
  Type::~Type(&local_48);
  getAsChannelSet32(&local_78,in_RDI);
  choc::buffer::
  copy<choc::buffer::BufferView<float,choc::buffer::InterleavedLayout>,choc::buffer::BufferView<float,choc::buffer::InterleavedLayout>>
            (&local_78,(BufferView<float,_choc::buffer::InterleavedLayout> *)&stack0x00000008);
  return in_RDI;
}

Assistant:

Value Value::createFloatVectorArray (choc::buffer::InterleavedView<float> data)
{
    Value v (Type::createVector (PrimitiveType::float32, data.getNumChannels()).createArray (data.getNumFrames()));
    copy (v.getAsChannelSet32(), data);
    return v;
}